

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-future.c
# Opt level: O1

int test(green_loop_t loop)

{
  int extraout_EAX;
  int iVar1;
  green_future_t pgVar2;
  void *__s;
  void *pvVar3;
  void *__size;
  int iVar4;
  green_loop_t pgVar5;
  green_future_t pgVar6;
  int i;
  void *p;
  int local_24;
  int *local_20;
  
  iVar4 = 0;
  pgVar2 = green_future_init((green_loop_t)0x0);
  if (pgVar2 == (green_future_t)0x0) {
    pgVar5 = loop;
    pgVar2 = green_future_init(loop);
    iVar4 = (int)pgVar5;
    if (pgVar2 == (green_future_t)0x0) goto LAB_00103dc7;
    local_20 = (int *)0x0;
    local_24 = 0;
    iVar4 = 0;
    iVar1 = green_future_result((green_future_t)0x0,&local_20,&local_24);
    if (iVar1 != 1) goto LAB_00103dcc;
    if (local_20 != (int *)0x0) goto LAB_00103dd1;
    if (local_24 != 0) goto LAB_00103dd6;
    iVar4 = 0;
    iVar1 = green_future_set_result((green_future_t)0x0,(void *)0x0,0);
    if (iVar1 != 1) goto LAB_00103ddb;
    iVar4 = 0;
    iVar1 = green_future_acquire((green_future_t)0x0);
    if (iVar1 != 1) goto LAB_00103de0;
    iVar4 = 0;
    iVar1 = green_future_release((green_future_t)0x0);
    if (iVar1 != 1) goto LAB_00103de5;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 3) goto LAB_00103dea;
    iVar4 = 0;
    iVar1 = green_future_done((green_future_t)0x0);
    if (iVar1 == 0) goto LAB_00103def;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103df4;
    pgVar6 = pgVar2;
    iVar1 = green_future_set_result(pgVar2,&local_24,7);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103df9;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103dfe;
    if (local_20 != &local_24) goto LAB_00103e03;
    if (local_24 != 7) goto LAB_00103e08;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 == 0) goto LAB_00103e0d;
    local_20 = (int *)0x0;
    local_24 = 0;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,(int *)0x0);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103e12;
    if (local_20 != &local_24) goto LAB_00103e17;
    if (local_24 != 0) goto LAB_00103e1c;
    local_20 = (int *)0x0;
    local_24 = 0;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,(void **)0x0,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103e21;
    if (local_20 != (int *)0x0) goto LAB_00103e26;
    if (local_24 != 7) goto LAB_00103e2b;
    pgVar6 = pgVar2;
    iVar1 = green_future_set_result(pgVar2,&local_24,7);
    iVar4 = (int)pgVar6;
    if (iVar1 != 8) goto LAB_00103e30;
    iVar1 = green_future_release(pgVar2);
    iVar4 = (int)pgVar2;
    if (iVar1 != 0) goto LAB_00103e35;
    pgVar2 = green_future_init(loop);
    iVar4 = (int)loop;
    if (pgVar2 == (green_future_t)0x0) goto LAB_00103e3a;
    iVar4 = 0;
    iVar1 = green_future_cancel((green_future_t)0x0);
    if (iVar1 != 1) goto LAB_00103e3f;
    local_20 = (int *)0x0;
    local_24 = 0;
    pgVar6 = pgVar2;
    iVar1 = green_future_cancel(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103e44;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 8) goto LAB_00103e49;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 == 0) goto LAB_00103e4e;
    if (local_20 != (int *)0x0) goto LAB_00103e53;
    if (local_24 != 0) goto LAB_00103e58;
    pgVar6 = pgVar2;
    iVar1 = green_future_cancel(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 8) goto LAB_00103e5d;
    pgVar6 = pgVar2;
    iVar1 = green_future_set_result(pgVar2,(void *)0x0,0);
    iVar4 = (int)pgVar6;
    if (iVar1 != 4) goto LAB_00103e62;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) {
      iVar1 = green_future_release(pgVar2);
      iVar4 = (int)pgVar2;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00103e6c;
    }
  }
  else {
    test_cold_1();
LAB_00103dc7:
    test_cold_35();
LAB_00103dcc:
    test_cold_2();
LAB_00103dd1:
    test_cold_3();
LAB_00103dd6:
    test_cold_4();
LAB_00103ddb:
    test_cold_5();
LAB_00103de0:
    test_cold_6();
LAB_00103de5:
    test_cold_7();
LAB_00103dea:
    test_cold_8();
LAB_00103def:
    test_cold_34();
LAB_00103df4:
    test_cold_9();
LAB_00103df9:
    test_cold_10();
LAB_00103dfe:
    test_cold_11();
LAB_00103e03:
    test_cold_12();
LAB_00103e08:
    test_cold_13();
LAB_00103e0d:
    test_cold_33();
LAB_00103e12:
    test_cold_14();
LAB_00103e17:
    test_cold_15();
LAB_00103e1c:
    test_cold_16();
LAB_00103e21:
    test_cold_17();
LAB_00103e26:
    test_cold_18();
LAB_00103e2b:
    test_cold_19();
LAB_00103e30:
    test_cold_20();
LAB_00103e35:
    test_cold_21();
LAB_00103e3a:
    test_cold_32();
LAB_00103e3f:
    test_cold_22();
LAB_00103e44:
    test_cold_23();
LAB_00103e49:
    test_cold_24();
LAB_00103e4e:
    test_cold_31();
LAB_00103e53:
    test_cold_25();
LAB_00103e58:
    test_cold_26();
LAB_00103e5d:
    test_cold_27();
LAB_00103e62:
    test_cold_28();
  }
  test_cold_30();
LAB_00103e6c:
  test_cold_29();
  __size = (void *)(long)iVar4;
  pvVar3 = __size;
  __s = malloc((size_t)__size);
  if (__s != (void *)0x0) {
    pvVar3 = memset(__s,0,(size_t)__size);
    return (int)pvVar3;
  }
  green_malloc_cold_1();
  free(pvVar3);
  return extraout_EAX;
}

Assistant:

int test(green_loop_t loop)
{
    green_future_t f = NULL;

    // Poller is required.
    f = green_future_init(NULL);
    check_eq(f, NULL);

    // Common case.
    f = green_future_init(loop);
    check_ne(f, NULL);

    void * p = NULL;
    int i = 0;

    // Future is required.
    check_eq(green_future_result(NULL, &p, &i), GREEN_EINVAL);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Future is required.
    check_eq(green_future_set_result(NULL, p, i), GREEN_EINVAL);

    // Future is required.
    check_eq(green_future_acquire(NULL), GREEN_EINVAL);
    check_eq(green_future_release(NULL), GREEN_EINVAL);

    // Check result before completion is not supported.
    check_eq(green_future_result(f, &p, &i), GREEN_EBUSY);

    // Function is NULL-proof.
    check_ne(green_future_done(NULL), 0);

    // Future is not done until set_result is called.
    check_eq(green_future_done(f), 0);

    // Once complete, we should be able to get the result.
    check_eq(green_future_set_result(f, &i, 7), 0);
    check_eq(green_future_result(f, &p, &i), 0);
    check_eq(p, &i);
    check_eq(i, 7);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, &p, NULL), 0);
    check_eq(p, &i);
    check_eq(i, 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, NULL, &i), 0);
    check_eq(p, NULL);
    check_eq(i, 7);

    // Setting the result again is prohibited.
    check_eq(green_future_set_result(f, &i, 7), GREEN_EBADFD);

    // Let's get us another future.
    check_eq(green_future_release(f), 0); f = NULL;
    f = green_future_init(loop);
    check_ne(f, NULL);

    // Future is required.
    check_eq(green_future_cancel(NULL), GREEN_EINVAL);

    // Once canceled, the future should be done.
    p = NULL;
    i = 0;
    check_eq(green_future_cancel(f), 0);
    check_eq(green_future_result(f, &p, &i), GREEN_EBADFD);
    check_ne(green_future_done(f), 0);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Cannot be canceled twice.
    check_eq(green_future_cancel(f), GREEN_EBADFD);

    // Cannot complete the future after it has been canceled.
    check_eq(green_future_set_result(f, NULL, 0), GREEN_ECANCELED);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // Done.
    check_eq(green_future_release(f), 0); f = NULL;

    return EXIT_SUCCESS;
}